

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Validator::validateIndexedArray(Validator *this,uint8_t *ptr,size_t length)

{
  long lVar1;
  undefined8 uVar2;
  Exception *this_00;
  char *msg;
  ValueLength VVar3;
  uint8_t *in_RDX;
  Validator *in_RSI;
  bool bVar4;
  ValueLength offset;
  uint8_t *member;
  ValueLength actualNrItems;
  uint8_t *e;
  uint8_t *p;
  uint8_t *firstMember;
  uint8_t *indexTable;
  ValueLength nrItems;
  ValueLength byteSize;
  ValueLength byteSizeLength;
  uint8_t head;
  undefined8 in_stack_ffffffffffffff38;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff40;
  uint8_t *in_stack_ffffffffffffff48;
  Exception *in_stack_ffffffffffffff50;
  Slice local_78;
  unsigned_long local_70;
  uint8_t *local_68;
  unsigned_long local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  unsigned_long local_38;
  uint8_t *local_30;
  undefined7 in_stack_ffffffffffffffe0;
  char cVar5;
  
  cVar5 = *(char *)&in_RSI->options;
  lVar1 = 1L << (cVar5 - 6U & 0x3f);
  validateBufferLength
            ((Validator *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48,
             (size_t)in_stack_ffffffffffffff40,SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
  local_30 = (uint8_t *)
             readIntegerNonEmpty<unsigned_long>
                       (in_stack_ffffffffffffff48,(ValueLength)in_stack_ffffffffffffff40);
  if (in_RDX < local_30) {
    uVar2 = __cxa_allocate_exception(0x18);
    Exception::Exception
              (in_stack_ffffffffffffff50,(ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20),
               (char *)in_stack_ffffffffffffff40);
    __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
  }
  if (cVar5 == '\t') {
    local_38 = readIntegerNonEmpty<unsigned_long>
                         (in_stack_ffffffffffffff48,(ValueLength)in_stack_ffffffffffffff40);
    if (local_38 == 0) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_ffffffffffffff50,(ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                 ,(char *)in_stack_ffffffffffffff40);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    local_40 = local_30 + (long)&in_RSI->options + (-(local_38 * lVar1) - lVar1);
    if ((local_40 < (uint8_t *)((long)&in_RSI->options + lVar1)) ||
       (in_RDX + lVar1 * -2 + (long)&in_RSI->options < local_40)) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_ffffffffffffff50,(ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                 ,(char *)in_stack_ffffffffffffff40);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    local_48 = (uint8_t *)((long)&in_RSI->options + lVar1 + 1);
  }
  else {
    local_38 = readIntegerNonEmpty<unsigned_long>
                         (in_stack_ffffffffffffff48,(ValueLength)in_stack_ffffffffffffff40);
    if (local_38 == 0) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_ffffffffffffff50,(ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                 ,(char *)in_stack_ffffffffffffff40);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    local_50 = (uint8_t *)((long)&in_RSI->options + lVar1 * 2 + 1);
    local_58 = local_50 + lVar1 * -2 + 8;
    if (local_30 + (long)&in_RSI->options < local_58) {
      local_58 = local_30 + (long)&in_RSI->options;
    }
    while( true ) {
      bVar4 = false;
      if (local_50 < local_58) {
        bVar4 = *local_50 == '\0';
      }
      if (!bVar4) break;
      local_50 = local_50 + 1;
    }
    if ((local_50 != (uint8_t *)((long)&in_RSI->options + lVar1 * 2 + 1)) &&
       (local_50 != (uint8_t *)((long)&in_RSI->_nesting + 1))) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception
                (this_00,(ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                 (char *)in_stack_ffffffffffffff40);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    local_40 = local_30 + ((long)&in_RSI->options - local_38 * lVar1);
    if (((local_40 < (uint8_t *)((long)&in_RSI->options + lVar1 * 2)) || (local_40 < local_50)) ||
       (in_RDX + ((long)&in_RSI->options - lVar1) < local_40)) {
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_ffffffffffffff50,(ExceptionType)((ulong)uVar2 >> 0x20),
                 (char *)in_stack_ffffffffffffff40);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    local_48 = local_50;
  }
  local_60 = 0;
  local_68 = local_48;
  while( true ) {
    if (local_40 <= local_68) {
      if (local_60 == local_38) {
        return;
      }
      uVar2 = __cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_ffffffffffffff50,(ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                 ,(char *)in_stack_ffffffffffffff40);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    validatePart(in_RSI,in_RDX,CONCAT17(cVar5,in_stack_ffffffffffffffe0),
                 SUB81((ulong)lVar1 >> 0x38,0));
    local_70 = readIntegerNonEmpty<unsigned_long>
                         (in_stack_ffffffffffffff48,(ValueLength)in_stack_ffffffffffffff40);
    if (local_70 != (long)local_68 - (long)in_RSI) break;
    Slice::Slice(&local_78,local_68);
    VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      (in_stack_ffffffffffffff40);
    local_68 = local_68 + VVar3;
    local_60 = local_60 + 1;
  }
  msg = (char *)__cxa_allocate_exception(0x18);
  Exception::Exception
            (in_stack_ffffffffffffff50,(ExceptionType)((ulong)in_stack_ffffffffffffff48 >> 0x20),msg
            );
  __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateIndexedArray(uint8_t const* ptr, std::size_t length) {
  // Array with index table, with 1-8 bytes lengths
  uint8_t head = *ptr;
  ValueLength const byteSizeLength =
      1ULL << (static_cast<ValueLength>(head) - 0x06U);
  validateBufferLength(1 + byteSizeLength + byteSizeLength + 1, length, true);
  ValueLength byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length is out of bounds");
  }

  ValueLength nrItems;
  uint8_t const* indexTable;
  uint8_t const* firstMember;

  if (head == 0x09U) {
    // byte length = 8
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + byteSize - byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array nrItems value is invalid");
    }

    indexTable = ptr + byteSize - byteSizeLength - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength ||
        indexTable > ptr + length - byteSizeLength - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is out of bounds");
    }

    firstMember = ptr + 1 + byteSizeLength;
  } else {
    // byte length = 1, 2 or 4
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + 1 + byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array nrItems value is invalid");
    }

    // look up first member
    uint8_t const* p = ptr + 1 + byteSizeLength + byteSizeLength;
    uint8_t const* e = p + (8 - byteSizeLength - byteSizeLength);
    if (e > ptr + byteSize) {
      e = ptr + byteSize;
    }
    while (p < e && *p == '\x00') {
      ++p;
    }

    // check if padding is correct
    if (p != ptr + 1 + byteSizeLength + byteSizeLength &&
        p != ptr + 1 + byteSizeLength + byteSizeLength +
                 (8 - byteSizeLength - byteSizeLength)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array padding is invalid");
    }

    indexTable = ptr + byteSize - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength + byteSizeLength || indexTable < p ||
        indexTable > ptr + length - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is out of bounds");
    }

    firstMember = p;
  }

  VELOCYPACK_ASSERT(nrItems > 0);

  ValueLength actualNrItems = 0;
  uint8_t const* member = firstMember;
  while (member < indexTable) {
    validatePart(member, indexTable - member, true);
    ValueLength offset = readIntegerNonEmpty<ValueLength>(
        indexTable + actualNrItems * byteSizeLength, byteSizeLength);
    if (offset != static_cast<ValueLength>(member - ptr)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is wrong");
    }

    member += Slice(member).byteSize();
    ++actualNrItems;
  }

  if (actualNrItems != nrItems) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array has more items than in index");
  }
}